

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

stbi__uint16 * stbi_load_from_file_16(FILE *f,int *x,int *y,int *comp,int req_comp)

{
  stbi__uint16 *psVar1;
  stbi__context s;
  stbi__context sStack_108;
  
  stbi__start_file(&sStack_108,f);
  psVar1 = stbi__load_and_postprocess_16bit(&sStack_108,x,y,comp,req_comp);
  if (psVar1 != (stbi__uint16 *)0x0) {
    fseek((FILE *)f,(long)((int)sStack_108.img_buffer - (int)sStack_108.img_buffer_end),1);
  }
  return psVar1;
}

Assistant:

STBIDEF stbi__uint16 *stbi_load_from_file_16(FILE *f, int *x, int *y, int *comp, int req_comp)
{
   stbi__uint16 *result;
   stbi__context s;
   stbi__start_file(&s,f);
   result = stbi__load_and_postprocess_16bit(&s,x,y,comp,req_comp);
   if (result) {
      // need to 'unget' all the characters in the IO buffer
      fseek(f, - (int) (s.img_buffer_end - s.img_buffer), SEEK_CUR);
   }
   return result;
}